

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandCexCut(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Aig_Man_t *p;
  Aig_Man_t *pMan;
  Abc_Ntk_t *pNtk;
  char *pcVar2;
  Aig_Man_t *pAigNew;
  Aig_Man_t *pAig;
  uint local_48;
  int fVerbose;
  int fAllFrames;
  int fUseOne;
  int fCombOnly;
  int iFrStop;
  int iFrStart;
  int c;
  Abc_Ntk_t *pNtkNew;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fCombOnly = 0;
  fUseOne = 1000000000;
  fAllFrames = 0;
  fVerbose = 0;
  local_48 = 0;
  pAig._4_4_ = 0;
  Extra_UtilGetoptReset();
LAB_0029a8f4:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"FGcnmvh");
    if (iVar1 == -1) {
      if (pAbc->pCex == (Abc_Cex_t *)0x0) {
        Abc_Print(1,"There is no current cex.\n");
        return 0;
      }
      if (pAbc->pNtkCur == (Abc_Ntk_t *)0x0) {
        Abc_Print(1,"There is no AIG in the &-space.\n");
        return 0;
      }
      iVar1 = Abc_NtkIsStrash(pAbc->pNtkCur);
      if (iVar1 == 0) {
        Abc_Print(1,"Current network is not an AIG.\n");
        return 0;
      }
      if (fUseOne == 1000000000) {
        fUseOne = pAbc->pCex->iFrame;
      }
      p = Abc_NtkToDar(pAbc->pNtkCur,0,1);
      pMan = Bmc_AigTargetStates(p,pAbc->pCex,fCombOnly,fUseOne,fAllFrames,fVerbose,local_48,
                                 pAig._4_4_);
      Aig_ManStop(p);
      if (pMan == (Aig_Man_t *)0x0) {
        Abc_Print(1,"Command has failed.\n");
        return 0;
      }
      pNtk = Abc_NtkFromAigPhase(pMan);
      pcVar2 = Extra_UtilStrsav(pAbc->pNtkCur->pName);
      pNtk->pName = pcVar2;
      Aig_ManStop(pMan);
      Abc_FrameReplaceCurrentNetwork(pAbc,pNtk);
      return 0;
    }
    switch(iVar1) {
    case 0x46:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-F\" should be followed by an integer.\n");
        goto LAB_0029abba;
      }
      fCombOnly = atoi(argv[globalUtilOptind]);
      iVar1 = fCombOnly;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by an integer.\n");
        goto LAB_0029abba;
      }
      fUseOne = atoi(argv[globalUtilOptind]);
      iVar1 = fUseOne;
      break;
    default:
      Abc_Print(-2,"Unknown switch.\n");
      goto LAB_0029abba;
    case 99:
      fAllFrames = fAllFrames ^ 1;
      goto LAB_0029a8f4;
    case 0x68:
      goto LAB_0029abba;
    case 0x6d:
      local_48 = local_48 ^ 1;
      goto LAB_0029a8f4;
    case 0x6e:
      fVerbose = fVerbose ^ 1;
      goto LAB_0029a8f4;
    case 0x76:
      pAig._4_4_ = pAig._4_4_ ^ 1;
      goto LAB_0029a8f4;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 0) {
LAB_0029abba:
      Abc_Print(-2,"usage: cexcut [-FG num] [-cnmvh]\n");
      Abc_Print(-2,"\t         creates logic for bad states using the current CEX\n");
      Abc_Print(-2,"\t-F num : 0-based number of the starting frame [default = %d]\n",
                (ulong)(uint)fCombOnly);
      Abc_Print(-2,"\t-G num : 0-based number of the ending frame [default = %d]\n",
                (ulong)(uint)fUseOne);
      pcVar2 = "no";
      if (fAllFrames != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-c     : toggle outputting unate combinational circuit [default = %s]\n",
                pcVar2);
      pcVar2 = "no";
      if (fVerbose != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-n     : toggle generating only one bad state [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_48 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-m     : toggle generating bad states for all frames after G [default = %s]\n"
                ,pcVar2);
      pcVar2 = "no";
      if (pAig._4_4_ != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandCexCut( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtkNew;
    int c, iFrStart = 0;
    int iFrStop     = ABC_INFINITY;
    int fCombOnly   = 0;
    int fUseOne     = 0;
    int fAllFrames  = 0;
    int fVerbose    = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FGcnmvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            iFrStop = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iFrStop < 0 )
                goto usage;
            break;
        case 'c':
            fCombOnly ^= 1;
            break;
        case 'n':
            fUseOne ^= 1;
            break;
        case 'm':
            fAllFrames ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            Abc_Print( -2, "Unknown switch.\n");
            goto usage;
        }
    }

    if ( pAbc->pCex == NULL )
    {
        Abc_Print( 1, "There is no current cex.\n");
        return 0;
    }
    if ( pAbc->pNtkCur == NULL )
    {
        Abc_Print( 1, "There is no AIG in the &-space.\n");
        return 0;
    }
    if ( !Abc_NtkIsStrash(pAbc->pNtkCur) )
    {
        Abc_Print( 1, "Current network is not an AIG.\n");
        return 0;
    }
    if ( iFrStop == ABC_INFINITY )
        iFrStop = pAbc->pCex->iFrame;

    {
        Aig_Man_t * pAig = Abc_NtkToDar( pAbc->pNtkCur, 0, 1 );
        Aig_Man_t * pAigNew = Bmc_AigTargetStates( pAig, pAbc->pCex, iFrStart, iFrStop, fCombOnly, fUseOne, fAllFrames, fVerbose );
        Aig_ManStop( pAig );
        if ( pAigNew == NULL )
        {
            Abc_Print( 1, "Command has failed.\n");
            return 0;
        }
        pNtkNew = Abc_NtkFromAigPhase( pAigNew );
        pNtkNew->pName = Extra_UtilStrsav( pAbc->pNtkCur->pName );
        Aig_ManStop( pAigNew );
        // update the network
        Abc_FrameReplaceCurrentNetwork( pAbc, pNtkNew );
    }
/*
    pGiaNew = Bmc_GiaTargetStates( pAbc->pGia, pAbc->pCex, iFrStart, iFrStop, fCombOnly, fUseOne, fVerbose );
    if ( pGiaNew == NULL )
    {
        Abc_Print( 1, "Command has failed.\n");
        return 0;
    }
    Abc_FrameUpdateGia( pAbc, pGiaNew );
*/
    return 0;

usage:
    Abc_Print( -2, "usage: cexcut [-FG num] [-cnmvh]\n" );
    Abc_Print( -2, "\t         creates logic for bad states using the current CEX\n" );
    Abc_Print( -2, "\t-F num : 0-based number of the starting frame [default = %d]\n", iFrStart );
    Abc_Print( -2, "\t-G num : 0-based number of the ending frame [default = %d]\n",   iFrStop );
    Abc_Print( -2, "\t-c     : toggle outputting unate combinational circuit [default = %s]\n",  fCombOnly? "yes": "no" );
    Abc_Print( -2, "\t-n     : toggle generating only one bad state [default = %s]\n", fUseOne? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle generating bad states for all frames after G [default = %s]\n", fAllFrames? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",  fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}